

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O1

void event_go_to_breakfast_time(tgestate_t *state)

{
  uint8_t *puVar1;
  
  state->bell = '(';
  queue_message(state,message_BREAKFAST_TIME);
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = '\x10';
    state->vischars[0].route.step = '\0';
    set_route(state,state->vischars);
  }
  set_prisoners_and_guards_route_B(state,(route_t *)&set_route_go_to_breakfast_t16);
  return;
}

Assistant:

static void event_go_to_breakfast_time(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_BREAKFAST_TIME);
  set_route_go_to_breakfast(state);
}